

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensemble.cpp
# Opt level: O2

void __thiscall NPT::ener(NPT *this)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  
  ener((NPT *)((long)&this->_vptr_NPT + (long)this->_vptr_NPT[-3]),in_RSI);
  return;
}

Assistant:

valtype NPT::ener(const vector<valtype>& vals) const {
  // Note that we don't do bound-check here
  // Also, we don't slice the input vector
  // by just assuming the hamiltonian functor
  // will use and only use as many as it needs
  // so that the last element is the volumn term
  return (H.ener(vals) + P*vals.back())/(kB*T);
}